

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  LogMessage *pLVar6;
  long *plVar7;
  Type *pTVar8;
  Type *pTVar9;
  Type *pTVar10;
  Type *pTVar11;
  int iVar12;
  string path;
  FileDescriptorProto *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  RepeatedPtrFieldBase *local_70;
  undefined1 local_68 [56];
  
  local_98 = value;
  bVar4 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>>
                    (&this->by_name_,
                     (first_type *)((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                     &local_98);
  if (!bVar4) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x78);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,"File already exists in database: ");
    pLVar6 = internal::LogMessage::operator<<
                       (pLVar6,(string *)
                               ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    local_68._0_8_ = local_68 + 0x10;
    local_68._8_8_ = (char *)0x0;
    local_68[0x10] = '\0';
  }
  else {
    plVar7 = (long *)((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    local_68._0_8_ = local_68 + 0x10;
    lVar2 = *plVar7;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,lVar2,plVar7[1] + lVar2);
  }
  if ((char *)local_68._8_8_ != (char *)0x0) {
    std::__cxx11::string::push_back((char)local_68);
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar12 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar12);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pTVar8->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      bVar4 = AddSymbol(this,&local_90,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_0038c8f3;
      pvVar3 = (file->name_).tagged_ptr_.ptr_;
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar12);
      bVar4 = AddNestedExtensions(this,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),pTVar8,
                                  local_98);
      if (!bVar4) goto LAB_0038c8f3;
      iVar12 = iVar12 + 1;
    } while (iVar12 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar12 = 0;
    do {
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar12);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pTVar9->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      bVar4 = AddSymbol(this,&local_90,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_0038c8f3;
      iVar12 = iVar12 + 1;
    } while (iVar12 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    iVar12 = 0;
    do {
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(file->extension_).super_RepeatedPtrFieldBase,iVar12);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pTVar10->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      bVar4 = AddSymbol(this,&local_90,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_0038c8f3;
      pvVar3 = (file->name_).tagged_ptr_.ptr_;
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(file->extension_).super_RepeatedPtrFieldBase,iVar12);
      bVar4 = AddExtension(this,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),pTVar10,local_98);
      if (!bVar4) goto LAB_0038c8f3;
      iVar12 = iVar12 + 1;
    } while (iVar12 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar12 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = iVar12 < 1;
  if (0 < iVar12) {
    local_70 = &(file->service_).super_RepeatedPtrFieldBase;
    iVar12 = 0;
    do {
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (local_70,iVar12);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pTVar11->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      bVar5 = AddSymbol(this,&local_90,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (!bVar5) break;
      iVar12 = iVar12 + 1;
      iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = iVar1 <= iVar12;
    } while (iVar12 < iVar1);
  }
LAB_0038c8f5:
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  return bVar4;
LAB_0038c8f3:
  bVar4 = false;
  goto LAB_0038c8f5;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}